

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O2

void run_container_andnot(run_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  rle16_t *prVar1;
  rle16_t *prVar2;
  rle16_t *prVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  uint16_t uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  
  iVar8 = src_2->n_runs + src_1->n_runs;
  if (dst->capacity < iVar8) {
    run_container_grow(dst,iVar8,false);
  }
  dst->n_runs = 0;
  prVar1 = src_1->runs;
  uVar11 = prVar1->value + 1 + (uint)prVar1->length;
  prVar2 = src_2->runs;
  uVar9 = (uint)prVar2->value;
  uVar10 = uVar9 + prVar2->length + 1;
  iVar12 = 0;
  uVar14 = 0;
  uVar5 = (uint)prVar1->value;
  iVar8 = 0;
LAB_0011a0fa:
  do {
    uVar6 = uVar5;
    uVar4 = (ushort)uVar6;
    uVar7 = (short)uVar11 + ~uVar4;
    do {
      while( true ) {
        if (src_1->n_runs <= (int)uVar14) {
          return;
        }
        if (src_2->n_runs <= iVar12) {
          prVar2 = dst->runs;
          dst->n_runs = iVar8 + 1;
          prVar2[iVar8].value = uVar4;
          prVar2[iVar8].length = uVar7;
          iVar12 = uVar14 + 1;
          iVar13 = src_1->n_runs - iVar12;
          if (iVar13 == 0 || src_1->n_runs < iVar12) {
            return;
          }
          memcpy(prVar2 + (iVar8 + 1),prVar1 + iVar12,(long)iVar13 << 2);
          dst->n_runs = dst->n_runs + ~uVar14 + src_1->n_runs;
          return;
        }
        if (uVar11 <= uVar9) {
          prVar3 = dst->runs;
          dst->n_runs = iVar8 + 1;
          prVar3[iVar8].value = uVar4;
          prVar3[iVar8].length = uVar7;
          iVar8 = iVar8 + 1;
          goto LAB_0011a186;
        }
        if (uVar6 < uVar10) break;
        iVar12 = iVar12 + 1;
        if (iVar12 < src_2->n_runs) {
          uVar9 = (uint)prVar2[iVar12].value;
          uVar10 = uVar9 + prVar2[iVar12].length + 1;
        }
      }
      iVar13 = iVar8;
      if (uVar6 < uVar9) {
        prVar3 = dst->runs;
        iVar13 = iVar8 + 1;
        dst->n_runs = iVar13;
        prVar3[iVar8].value = uVar4;
        prVar3[iVar8].length = (short)uVar9 + ~uVar4;
      }
      uVar5 = uVar10;
      iVar8 = iVar13;
      if (uVar10 < uVar11) goto LAB_0011a0fa;
LAB_0011a186:
      uVar14 = uVar14 + 1;
    } while (src_1->n_runs <= (int)uVar14);
    uVar11 = (uint)prVar1[(int)uVar14].value + (uint)prVar1[(int)uVar14].length + 1;
    uVar5 = (uint)prVar1[(int)uVar14].value;
  } while( true );
}

Assistant:

void run_container_andnot(const run_container_t *src_1,
                          const run_container_t *src_2, run_container_t *dst) {
    // following Java implementation as of June 2016

    if (dst->capacity < src_1->n_runs + src_2->n_runs)
        run_container_grow(dst, src_1->n_runs + src_2->n_runs, false);

    dst->n_runs = 0;

    int rlepos1 = 0;
    int rlepos2 = 0;
    int32_t start = src_1->runs[rlepos1].value;
    int32_t end = start + src_1->runs[rlepos1].length + 1;
    int32_t start2 = src_2->runs[rlepos2].value;
    int32_t end2 = start2 + src_2->runs[rlepos2].length + 1;

    while ((rlepos1 < src_1->n_runs) && (rlepos2 < src_2->n_runs)) {
        if (end <= start2) {
            // output the first run
            dst->runs[dst->n_runs++] = MAKE_RLE16(start, end - start - 1);
            rlepos1++;
            if (rlepos1 < src_1->n_runs) {
                start = src_1->runs[rlepos1].value;
                end = start + src_1->runs[rlepos1].length + 1;
            }
        } else if (end2 <= start) {
            // exit the second run
            rlepos2++;
            if (rlepos2 < src_2->n_runs) {
                start2 = src_2->runs[rlepos2].value;
                end2 = start2 + src_2->runs[rlepos2].length + 1;
            }
        } else {
            if (start < start2) {
                dst->runs[dst->n_runs++] =
                    MAKE_RLE16(start, start2 - start - 1);
            }
            if (end2 < end) {
                start = end2;
            } else {
                rlepos1++;
                if (rlepos1 < src_1->n_runs) {
                    start = src_1->runs[rlepos1].value;
                    end = start + src_1->runs[rlepos1].length + 1;
                }
            }
        }
    }
    if (rlepos1 < src_1->n_runs) {
        dst->runs[dst->n_runs++] = MAKE_RLE16(start, end - start - 1);
        rlepos1++;
        if (rlepos1 < src_1->n_runs) {
            memcpy(dst->runs + dst->n_runs, src_1->runs + rlepos1,
                   sizeof(rle16_t) * (src_1->n_runs - rlepos1));
            dst->n_runs += src_1->n_runs - rlepos1;
        }
    }
}